

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_circmod(lys_module *module,char *value,int type)

{
  uint8_t uVar1;
  ly_ctx *ctx;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  ctx = module->ctx;
  if (module->name == value) {
LAB_00128a35:
    ly_vlog(ctx,(uint)(type == 0) + LYE_CIRC_IMPORTS,LY_VLOG_NONE,(void *)0x0);
    iVar2 = -1;
  }
  else {
    uVar1 = (ctx->models).parsing_sub_modules_count;
    if (uVar1 != '\0') {
      lVar3 = 0;
      do {
        if ((ctx->models).parsing_sub_modules[lVar3]->name == value) goto LAB_00128a35;
        lVar3 = lVar3 + 1;
      } while (uVar1 != (uint8_t)lVar3);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
lyp_check_circmod(struct lys_module *module, const char *value, int type)
{
    LY_ECODE code = type ? LYE_CIRC_IMPORTS : LYE_CIRC_INCLUDES;
    struct ly_modules_list *models = &module->ctx->models;
    uint8_t i;

    /* include/import itself */
    if (ly_strequal(module->name, value, 1)) {
        LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
        return -1;
    }

    /* currently parsed modules */
    for (i = 0; i < models->parsing_sub_modules_count; i++) {
        if (ly_strequal(models->parsing_sub_modules[i]->name, value, 1)) {
            LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
            return -1;
        }
    }

    return 0;
}